

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::SpectrumImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,pbrt::MIPMapFilterOptions&,pbrt::WrapMode&,float&,bool&,pbrt::ColorEncodingHandle&,pbrt::SpectrumType&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,SpectrumImageTexture *p,
          TextureMapping2DHandle *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          MIPMapFilterOptions *args_2,WrapMode *args_3,float *args_4,bool *args_5,
          ColorEncodingHandle *args_6,SpectrumType *args_7,polymorphic_allocator<std::byte> *args_8)

{
  pointer pcVar1;
  string local_60;
  uintptr_t local_40;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_38;
  
  local_38.bits =
       (args->
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       ).bits;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  pcVar1 = (args_1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + args_1->_M_string_length);
  local_40 = (args_6->
             super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             ).bits;
  pbrt::SpectrumImageTexture::SpectrumImageTexture
            (p,(TextureMapping2DHandle *)&local_38,&local_60,*args_2,*args_3,*args_4,*args_5,
             (ColorEncodingHandle)&local_40,*args_7,args_8->memoryResource);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }